

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O2

void __thiscall imrt::Station::setUniformIntensity(Station *this,double intensity)

{
  long lVar1;
  int iVar2;
  pair<int,_int> pVar3;
  int a;
  long lVar4;
  int i;
  long lVar5;
  int j;
  pair<int,_int> pVar6;
  
  for (lVar4 = 0; lVar4 < this->max_apertures; lVar4 = lVar4 + 1) {
    for (lVar5 = 0; iVar2 = Collimator::getXdim(this->collimator), lVar5 < iVar2; lVar5 = lVar5 + 1)
    {
      pVar3 = Collimator::getActiveRange(this->collimator,(int)lVar5,this->angle);
      pVar6 = pVar3;
      if (-1 < pVar3.first) {
        while (iVar2 = pVar6.first, iVar2 <= pVar3.second) {
          lVar1 = *(long *)&(this->A).
                            super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar4].
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data;
          if ((*(int *)(lVar1 + lVar5 * 8) <= iVar2) && (iVar2 <= *(int *)(lVar1 + 4 + lVar5 * 8)))
          {
            change_intensity(this,(int)lVar5,iVar2,intensity,
                             (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              *)0x0);
          }
          pVar6.first = iVar2 + 1;
          pVar6.second = 0;
        }
      }
    }
  }
  return;
}

Assistant:

void Station::setUniformIntensity(double intensity){
    for (int a=0 ; a<max_apertures; a++) {
      for (int i=0; i < collimator.getXdim(); i++) {
        pair <int,int> aux = collimator.getActiveRange(i,angle);
        if (aux.first<0) continue;
        for (int j=aux.first; j<=aux.second; j++) {
          if (j>=A[a][i].first && j<=A[a][i].second){
            change_intensity(i, j, intensity);
          }
        }
      }
    }
  }